

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_d.c
# Opt level: O0

void test_option_d(void)

{
  wchar_t wVar1;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  wchar_t in_stack_00000010;
  int r;
  char *in_stack_00000018;
  undefined4 in_stack_00000020;
  wchar_t in_stack_00000024;
  char *in_stack_00000028;
  long in_stack_00000080;
  char *in_stack_00000088;
  wchar_t in_stack_00000094;
  char *in_stack_00000098;
  char *in_stack_00000498;
  wchar_t in_stack_000004a4;
  char *in_stack_000004a8;
  char *in_stack_ffffffffffffffe8;
  char *pcVar2;
  undefined4 in_stack_fffffffffffffff0;
  wchar_t in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  assertion_make_dir((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8,L'\0');
  assertion_make_file(in_stack_00000028,in_stack_00000024,in_stack_00000018,r,in_stack_00000010,
                      in_stack_00000008);
  wVar1 = systemf("echo dir/file | %s -o > archive.cpio 2>archive.err",testprog);
  pcVar2 = (char *)0x0;
  assertion_equal_int(in_stack_00000008,unaff_retaddr,CONCAT44(wVar1,in_stack_fffffffffffffff8),
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                      (char *)0x112406,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
  assertion_text_file_contents
            (in_stack_00000028,in_stack_00000024,in_stack_00000018,
             (char *)CONCAT44(r,in_stack_00000010));
  assertion_file_size(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000080);
  assertion_make_dir((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                     pcVar2,L'\0');
  assertion_chdir((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,pcVar2
                 );
  wVar1 = systemf("%s -i < ../archive.cpio >out 2>err",testprog);
  pcVar2 = (char *)0x0;
  assertion_equal_int(in_stack_00000008,unaff_retaddr,CONCAT44(wVar1,in_stack_fffffffffffffff8),
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                      (char *)0x1124c4,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
  assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
  assertion_file_not_exists
            ((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,pcVar2);
  assertion_chdir((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,pcVar2
                 );
  assertion_make_dir((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                     pcVar2,L'\0');
  assertion_chdir((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,pcVar2
                 );
  wVar1 = systemf("%s -id < ../archive.cpio >out 2>err",testprog);
  pcVar2 = (char *)0x0;
  assertion_equal_int(in_stack_00000008,unaff_retaddr,CONCAT44(wVar1,in_stack_fffffffffffffff8),
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                      (char *)0x11258e,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
  assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
  assertion_text_file_contents
            (in_stack_00000028,in_stack_00000024,in_stack_00000018,
             (char *)CONCAT44(r,in_stack_00000010));
  assertion_file_exists
            ((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,pcVar2);
  return;
}

Assistant:

DEFINE_TEST(test_option_d)
{
	int r;

	/*
	 * Create a file in a directory.
	 */
	assertMakeDir("dir", 0755);
	assertMakeFile("dir/file", 0644, NULL);

	/* Create an archive. */
	r = systemf("echo dir/file | %s -o > archive.cpio 2>archive.err", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "archive.err");
	assertFileSize("archive.cpio", 512);

	/* Dearchive without -d, this should fail. */
	assertMakeDir("without-d", 0755);
	assertChdir("without-d");
	r = systemf("%s -i < ../archive.cpio >out 2>err", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("out");
	/* And the file should not be restored. */
	assertFileNotExists("dir/file");

	/* Dearchive with -d, this should succeed. */
	assertChdir("..");
	assertMakeDir("with-d", 0755);
	assertChdir("with-d");
	r = systemf("%s -id < ../archive.cpio >out 2>err", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("out");
	assertTextFileContents("1 block\n", "err");
	/* And the file should be restored. */
	assertFileExists("dir/file");
}